

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool re2::IsValidCaptureName(StringPiece *name)

{
  char cVar1;
  int iVar2;
  int local_1c;
  int c;
  int i;
  StringPiece *name_local;
  
  iVar2 = StringPiece::size(name);
  if (iVar2 == 0) {
    name_local._7_1_ = false;
  }
  else {
    for (local_1c = 0; iVar2 = StringPiece::size(name), local_1c < iVar2; local_1c = local_1c + 1) {
      cVar1 = StringPiece::operator[](name,local_1c);
      if ((((cVar1 < '0') || ('9' < cVar1)) && ((cVar1 < 'a' || ('z' < cVar1)))) &&
         (((cVar1 < 'A' || ('Z' < cVar1)) && (cVar1 != '_')))) {
        return false;
      }
    }
    name_local._7_1_ = true;
  }
  return name_local._7_1_;
}

Assistant:

static bool IsValidCaptureName(const StringPiece& name) {
  if (name.size() == 0)
    return false;
  for (int i = 0; i < name.size(); i++) {
    int c = name[i];
    if (('0' <= c && c <= '9') ||
        ('a' <= c && c <= 'z') ||
        ('A' <= c && c <= 'Z') ||
        c == '_')
      continue;
    return false;
  }
  return true;
}